

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

int __thiscall Darts::Details::DawgBuilder::init(DawgBuilder *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  DawgNode *this_00;
  DawgBuilder *unaff_retaddr;
  uint in_stack_fffffffffffffff0;
  uint uVar1;
  
  uVar1 = 0;
  AutoPool<unsigned_int>::resize
            ((AutoPool<unsigned_int> *)unaff_retaddr,(size_t)this,
             (uint *)(ulong)in_stack_fffffffffffffff0);
  append_node(unaff_retaddr);
  append_unit((DawgBuilder *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  this->num_states_ = 1;
  this_00 = AutoPool<Darts::Details::DawgNode>::operator[]
                      ((AutoPool<Darts::Details::DawgNode> *)
                       CONCAT44(uVar1,in_stack_fffffffffffffff0),(size_t)this);
  DawgNode::set_label(this_00,0xff);
  AutoStack<unsigned_int>::push((AutoStack<unsigned_int> *)((ulong)uVar1 << 0x20),(uint *)this);
  return extraout_EAX;
}

Assistant:

inline void DawgBuilder::init() {
  table_.resize(INITIAL_TABLE_SIZE, 0);

  append_node();
  append_unit();

  num_states_ = 1;

  nodes_[0].set_label(0xFF);
  node_stack_.push(0);
}